

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NNShaperTest.cpp
# Opt level: O2

int testSamePaddingConvolution2(void)

{
  ModelDescription *pMVar1;
  FeatureDescription *pFVar2;
  FeatureType *pFVar3;
  ArrayFeatureType *this;
  ArrayFeatureType_ShapeRange *pAVar4;
  SizeRange *pSVar5;
  NeuralNetwork *pNVar6;
  NeuralNetworkLayer *this_00;
  ConvolutionLayerParams *this_01;
  WeightParams *this_02;
  ShapeConstraint *pSVar7;
  ShapeRange *pSVar8;
  size_t sVar9;
  ostream *poVar10;
  int iVar11;
  char *pcVar12;
  bool bVar13;
  RangeValue RVar14;
  allocator local_d1;
  string local_d0;
  Model m1;
  NeuralNetworkShaper shapes;
  
  CoreML::Specification::Model::Model(&m1);
  pMVar1 = CoreML::Specification::Model::mutable_description(&m1);
  pFVar2 = google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::Add
                     (&pMVar1->input_);
  CoreML::Specification::FeatureDescription::set_name(pFVar2,"input");
  pFVar3 = CoreML::Specification::FeatureDescription::mutable_type(pFVar2);
  this = CoreML::Specification::FeatureType::mutable_multiarraytype(pFVar3);
  pAVar4 = CoreML::Specification::ArrayFeatureType::mutable_shaperange(this);
  pSVar5 = google::protobuf::RepeatedPtrField<CoreML::Specification::SizeRange>::Add
                     (&pAVar4->sizeranges_);
  pSVar5->lowerbound_ = 4;
  pSVar5->upperbound_ = 4;
  pAVar4 = CoreML::Specification::ArrayFeatureType::mutable_shaperange(this);
  pSVar5 = google::protobuf::RepeatedPtrField<CoreML::Specification::SizeRange>::Add
                     (&pAVar4->sizeranges_);
  pSVar5->lowerbound_ = 100;
  pSVar5->upperbound_ = 100;
  pAVar4 = CoreML::Specification::ArrayFeatureType::mutable_shaperange(this);
  pSVar5 = google::protobuf::RepeatedPtrField<CoreML::Specification::SizeRange>::Add
                     (&pAVar4->sizeranges_);
  pSVar5->lowerbound_ = 100;
  pSVar5->upperbound_ = 200;
  pMVar1 = CoreML::Specification::Model::mutable_description(&m1);
  pFVar2 = google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::Add
                     (&pMVar1->output_);
  CoreML::Specification::FeatureDescription::set_name(pFVar2,"output");
  pFVar3 = CoreML::Specification::FeatureDescription::mutable_type(pFVar2);
  CoreML::Specification::FeatureType::mutable_multiarraytype(pFVar3);
  pNVar6 = CoreML::Specification::Model::mutable_neuralnetwork(&m1);
  this_00 = google::protobuf::RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer>::Add
                      (&pNVar6->layers_);
  CoreML::Specification::NeuralNetworkLayer::add_input(this_00,"input");
  CoreML::Specification::NeuralNetworkLayer::add_output(this_00,"output");
  this_01 = CoreML::Specification::NeuralNetworkLayer::mutable_convolution(this_00);
  this_01->outputchannels_ = 5;
  this_01->kernelchannels_ = 4;
  CoreML::Specification::ConvolutionLayerParams::add_kernelsize(this_01,7);
  CoreML::Specification::ConvolutionLayerParams::add_kernelsize(this_01,8);
  CoreML::Specification::ConvolutionLayerParams::mutable_same(this_01);
  CoreML::Specification::ConvolutionLayerParams::add_stride(this_01,2);
  CoreML::Specification::ConvolutionLayerParams::add_stride(this_01,3);
  this_01->hasbias_ = false;
  iVar11 = 0x460;
  while (bVar13 = iVar11 != 0, iVar11 = iVar11 + -1, bVar13) {
    this_02 = CoreML::Specification::ConvolutionLayerParams::mutable_weights(this_01);
    CoreML::Specification::WeightParams::add_floatvalue(this_02,1.0);
  }
  CoreML::NeuralNetworkShaper::NeuralNetworkShaper(&shapes,&m1,true);
  std::__cxx11::string::string((string *)&local_d0,"input",&local_d1);
  pSVar7 = CoreML::NeuralNetworkShaper::shape(&shapes,&local_d0);
  std::__cxx11::string::~string((string *)&local_d0);
  pSVar8 = CoreML::ShapeConstraint::sequenceRange(pSVar7);
  sVar9 = CoreML::ShapeRange::minimumValue(pSVar8);
  if (sVar9 == 0) {
    pSVar8 = CoreML::ShapeConstraint::sequenceRange(pSVar7);
    RVar14 = CoreML::ShapeRange::maximumValue(pSVar8);
    local_d0._M_string_length = RVar14._val;
    local_d0._M_dataplus._M_p._0_1_ = RVar14._isUnbound;
    bVar13 = CoreML::RangeValue::isUnbound((RangeValue *)&local_d0);
    if (bVar13) {
      pSVar8 = CoreML::ShapeConstraint::batchRange(pSVar7);
      sVar9 = CoreML::ShapeRange::minimumValue(pSVar8);
      if (sVar9 == 0) {
        pSVar8 = CoreML::ShapeConstraint::batchRange(pSVar7);
        RVar14 = CoreML::ShapeRange::maximumValue(pSVar8);
        local_d0._M_string_length = RVar14._val;
        local_d0._M_dataplus._M_p._0_1_ = RVar14._isUnbound;
        bVar13 = CoreML::RangeValue::isUnbound((RangeValue *)&local_d0);
        if (bVar13) {
          pSVar8 = CoreML::ShapeConstraint::channelRange(pSVar7);
          sVar9 = CoreML::ShapeRange::minimumValue(pSVar8);
          if (sVar9 == 4) {
            pSVar8 = CoreML::ShapeConstraint::channelRange(pSVar7);
            RVar14 = CoreML::ShapeRange::maximumValue(pSVar8);
            local_d0._M_string_length = RVar14._val;
            local_d0._M_dataplus._M_p._0_1_ = RVar14._isUnbound;
            sVar9 = CoreML::RangeValue::value((RangeValue *)&local_d0);
            if (sVar9 == 4) {
              pSVar8 = CoreML::ShapeConstraint::heightRange(pSVar7);
              sVar9 = CoreML::ShapeRange::minimumValue(pSVar8);
              if (sVar9 == 100) {
                pSVar8 = CoreML::ShapeConstraint::heightRange(pSVar7);
                RVar14 = CoreML::ShapeRange::maximumValue(pSVar8);
                local_d0._M_string_length = RVar14._val;
                local_d0._M_dataplus._M_p._0_1_ = RVar14._isUnbound;
                sVar9 = CoreML::RangeValue::value((RangeValue *)&local_d0);
                if (sVar9 == 100) {
                  pSVar8 = CoreML::ShapeConstraint::widthRange(pSVar7);
                  sVar9 = CoreML::ShapeRange::minimumValue(pSVar8);
                  if (sVar9 == 100) {
                    pSVar8 = CoreML::ShapeConstraint::widthRange(pSVar7);
                    RVar14 = CoreML::ShapeRange::maximumValue(pSVar8);
                    local_d0._M_string_length = RVar14._val;
                    local_d0._M_dataplus._M_p._0_1_ = RVar14._isUnbound;
                    sVar9 = CoreML::RangeValue::value((RangeValue *)&local_d0);
                    if (sVar9 == 200) {
                      std::__cxx11::string::string((string *)&local_d0,"output",&local_d1);
                      pSVar7 = CoreML::NeuralNetworkShaper::shape(&shapes,&local_d0);
                      std::__cxx11::string::~string((string *)&local_d0);
                      pSVar8 = CoreML::ShapeConstraint::sequenceRange(pSVar7);
                      sVar9 = CoreML::ShapeRange::minimumValue(pSVar8);
                      if (sVar9 == 0) {
                        pSVar8 = CoreML::ShapeConstraint::sequenceRange(pSVar7);
                        RVar14 = CoreML::ShapeRange::maximumValue(pSVar8);
                        local_d0._M_string_length = RVar14._val;
                        local_d0._M_dataplus._M_p._0_1_ = RVar14._isUnbound;
                        bVar13 = CoreML::RangeValue::isUnbound((RangeValue *)&local_d0);
                        if (bVar13) {
                          pSVar8 = CoreML::ShapeConstraint::batchRange(pSVar7);
                          sVar9 = CoreML::ShapeRange::minimumValue(pSVar8);
                          if (sVar9 == 0) {
                            pSVar8 = CoreML::ShapeConstraint::batchRange(pSVar7);
                            RVar14 = CoreML::ShapeRange::maximumValue(pSVar8);
                            local_d0._M_string_length = RVar14._val;
                            local_d0._M_dataplus._M_p._0_1_ = RVar14._isUnbound;
                            bVar13 = CoreML::RangeValue::isUnbound((RangeValue *)&local_d0);
                            if (bVar13) {
                              pSVar8 = CoreML::ShapeConstraint::channelRange(pSVar7);
                              sVar9 = CoreML::ShapeRange::minimumValue(pSVar8);
                              if (sVar9 == 5) {
                                pSVar8 = CoreML::ShapeConstraint::channelRange(pSVar7);
                                RVar14 = CoreML::ShapeRange::maximumValue(pSVar8);
                                local_d0._M_string_length = RVar14._val;
                                local_d0._M_dataplus._M_p._0_1_ = RVar14._isUnbound;
                                sVar9 = CoreML::RangeValue::value((RangeValue *)&local_d0);
                                if (sVar9 == 5) {
                                  pSVar8 = CoreML::ShapeConstraint::heightRange(pSVar7);
                                  sVar9 = CoreML::ShapeRange::minimumValue(pSVar8);
                                  if (sVar9 == 0x32) {
                                    pSVar8 = CoreML::ShapeConstraint::heightRange(pSVar7);
                                    RVar14 = CoreML::ShapeRange::maximumValue(pSVar8);
                                    local_d0._M_string_length = RVar14._val;
                                    local_d0._M_dataplus._M_p._0_1_ = RVar14._isUnbound;
                                    sVar9 = CoreML::RangeValue::value((RangeValue *)&local_d0);
                                    if (sVar9 == 0x32) {
                                      pSVar8 = CoreML::ShapeConstraint::widthRange(pSVar7);
                                      sVar9 = CoreML::ShapeRange::minimumValue(pSVar8);
                                      if (sVar9 == 0x22) {
                                        pSVar8 = CoreML::ShapeConstraint::widthRange(pSVar7);
                                        RVar14 = CoreML::ShapeRange::maximumValue(pSVar8);
                                        local_d0._M_string_length = RVar14._val;
                                        local_d0._M_dataplus._M_p._0_1_ = RVar14._isUnbound;
                                        sVar9 = CoreML::RangeValue::value((RangeValue *)&local_d0);
                                        iVar11 = 0;
                                        if (sVar9 == 0x43) goto LAB_0013acf7;
                                        poVar10 = std::operator<<((ostream *)&std::cout,
                                                                                                                                    
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/tests/NNShaperTest.cpp"
                                                  );
                                        poVar10 = std::operator<<(poVar10,":");
                                        poVar10 = (ostream *)
                                                  std::ostream::operator<<((ostream *)poVar10,0x1e6)
                                        ;
                                        poVar10 = std::operator<<(poVar10,": error: ");
                                        pcVar12 = 
                                        "outShape.widthRange().maximumValue().value() == 67";
                                      }
                                      else {
                                        poVar10 = std::operator<<((ostream *)&std::cout,
                                                                                                                                    
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/tests/NNShaperTest.cpp"
                                                  );
                                        poVar10 = std::operator<<(poVar10,":");
                                        poVar10 = (ostream *)
                                                  std::ostream::operator<<((ostream *)poVar10,0x1e5)
                                        ;
                                        poVar10 = std::operator<<(poVar10,": error: ");
                                        pcVar12 = "outShape.widthRange().minimumValue() == 34";
                                      }
                                    }
                                    else {
                                      poVar10 = std::operator<<((ostream *)&std::cout,
                                                                                                                                
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/tests/NNShaperTest.cpp"
                                                  );
                                      poVar10 = std::operator<<(poVar10,":");
                                      poVar10 = (ostream *)
                                                std::ostream::operator<<((ostream *)poVar10,0x1e3);
                                      poVar10 = std::operator<<(poVar10,": error: ");
                                      pcVar12 = 
                                      "outShape.heightRange().maximumValue().value() == 50";
                                    }
                                  }
                                  else {
                                    poVar10 = std::operator<<((ostream *)&std::cout,
                                                                                                                            
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/tests/NNShaperTest.cpp"
                                                  );
                                    poVar10 = std::operator<<(poVar10,":");
                                    poVar10 = (ostream *)
                                              std::ostream::operator<<((ostream *)poVar10,0x1e2);
                                    poVar10 = std::operator<<(poVar10,": error: ");
                                    pcVar12 = "outShape.heightRange().minimumValue() == 50";
                                  }
                                }
                                else {
                                  poVar10 = std::operator<<((ostream *)&std::cout,
                                                                                                                        
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/tests/NNShaperTest.cpp"
                                                  );
                                  poVar10 = std::operator<<(poVar10,":");
                                  poVar10 = (ostream *)
                                            std::ostream::operator<<((ostream *)poVar10,0x1e0);
                                  poVar10 = std::operator<<(poVar10,": error: ");
                                  pcVar12 = "outShape.channelRange().maximumValue().value() == 5";
                                }
                              }
                              else {
                                poVar10 = std::operator<<((ostream *)&std::cout,
                                                                                                                    
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/tests/NNShaperTest.cpp"
                                                  );
                                poVar10 = std::operator<<(poVar10,":");
                                poVar10 = (ostream *)
                                          std::ostream::operator<<((ostream *)poVar10,0x1df);
                                poVar10 = std::operator<<(poVar10,": error: ");
                                pcVar12 = "outShape.channelRange().minimumValue() == 5";
                              }
                            }
                            else {
                              poVar10 = std::operator<<((ostream *)&std::cout,
                                                                                                                
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/tests/NNShaperTest.cpp"
                                                  );
                              poVar10 = std::operator<<(poVar10,":");
                              poVar10 = (ostream *)
                                        std::ostream::operator<<((ostream *)poVar10,0x1dd);
                              poVar10 = std::operator<<(poVar10,": error: ");
                              pcVar12 = "outShape.batchRange().maximumValue().isUnbound()";
                            }
                          }
                          else {
                            poVar10 = std::operator<<((ostream *)&std::cout,
                                                                                                            
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/tests/NNShaperTest.cpp"
                                                  );
                            poVar10 = std::operator<<(poVar10,":");
                            poVar10 = (ostream *)std::ostream::operator<<((ostream *)poVar10,0x1dc);
                            poVar10 = std::operator<<(poVar10,": error: ");
                            pcVar12 = "outShape.batchRange().minimumValue() == 0";
                          }
                        }
                        else {
                          poVar10 = std::operator<<((ostream *)&std::cout,
                                                                                                        
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/tests/NNShaperTest.cpp"
                                                  );
                          poVar10 = std::operator<<(poVar10,":");
                          poVar10 = (ostream *)std::ostream::operator<<((ostream *)poVar10,0x1da);
                          poVar10 = std::operator<<(poVar10,": error: ");
                          pcVar12 = "outShape.sequenceRange().maximumValue().isUnbound()";
                        }
                      }
                      else {
                        poVar10 = std::operator<<((ostream *)&std::cout,
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/tests/NNShaperTest.cpp"
                                                 );
                        poVar10 = std::operator<<(poVar10,":");
                        poVar10 = (ostream *)std::ostream::operator<<((ostream *)poVar10,0x1d9);
                        poVar10 = std::operator<<(poVar10,": error: ");
                        pcVar12 = "outShape.sequenceRange().minimumValue() == 0";
                      }
                      poVar10 = std::operator<<(poVar10,pcVar12);
                      poVar10 = std::operator<<(poVar10," was false, expected true.");
                      std::endl<char,std::char_traits<char>>(poVar10);
                      iVar11 = 1;
                      goto LAB_0013acf7;
                    }
                    poVar10 = std::operator<<((ostream *)&std::cout,
                                              "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/tests/NNShaperTest.cpp"
                                             );
                    poVar10 = std::operator<<(poVar10,":");
                    poVar10 = (ostream *)std::ostream::operator<<((ostream *)poVar10,0x1d6);
                    poVar10 = std::operator<<(poVar10,": error: ");
                    pcVar12 = "inShape.widthRange().maximumValue().value() == 200";
                  }
                  else {
                    poVar10 = std::operator<<((ostream *)&std::cout,
                                              "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/tests/NNShaperTest.cpp"
                                             );
                    poVar10 = std::operator<<(poVar10,":");
                    poVar10 = (ostream *)std::ostream::operator<<((ostream *)poVar10,0x1d5);
                    poVar10 = std::operator<<(poVar10,": error: ");
                    pcVar12 = "inShape.widthRange().minimumValue() == 100";
                  }
                }
                else {
                  poVar10 = std::operator<<((ostream *)&std::cout,
                                            "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/tests/NNShaperTest.cpp"
                                           );
                  poVar10 = std::operator<<(poVar10,":");
                  poVar10 = (ostream *)std::ostream::operator<<((ostream *)poVar10,0x1d3);
                  poVar10 = std::operator<<(poVar10,": error: ");
                  pcVar12 = "inShape.heightRange().maximumValue().value() == 100";
                }
              }
              else {
                poVar10 = std::operator<<((ostream *)&std::cout,
                                          "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/tests/NNShaperTest.cpp"
                                         );
                poVar10 = std::operator<<(poVar10,":");
                poVar10 = (ostream *)std::ostream::operator<<((ostream *)poVar10,0x1d2);
                poVar10 = std::operator<<(poVar10,": error: ");
                pcVar12 = "inShape.heightRange().minimumValue() == 100";
              }
            }
            else {
              poVar10 = std::operator<<((ostream *)&std::cout,
                                        "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/tests/NNShaperTest.cpp"
                                       );
              poVar10 = std::operator<<(poVar10,":");
              poVar10 = (ostream *)std::ostream::operator<<((ostream *)poVar10,0x1d0);
              poVar10 = std::operator<<(poVar10,": error: ");
              pcVar12 = "inShape.channelRange().maximumValue().value() == 4";
            }
          }
          else {
            poVar10 = std::operator<<((ostream *)&std::cout,
                                      "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/tests/NNShaperTest.cpp"
                                     );
            poVar10 = std::operator<<(poVar10,":");
            poVar10 = (ostream *)std::ostream::operator<<((ostream *)poVar10,0x1cf);
            poVar10 = std::operator<<(poVar10,": error: ");
            pcVar12 = "inShape.channelRange().minimumValue() == 4";
          }
        }
        else {
          poVar10 = std::operator<<((ostream *)&std::cout,
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/tests/NNShaperTest.cpp"
                                   );
          poVar10 = std::operator<<(poVar10,":");
          poVar10 = (ostream *)std::ostream::operator<<((ostream *)poVar10,0x1cd);
          poVar10 = std::operator<<(poVar10,": error: ");
          pcVar12 = "inShape.batchRange().maximumValue().isUnbound()";
        }
      }
      else {
        poVar10 = std::operator<<((ostream *)&std::cout,
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/tests/NNShaperTest.cpp"
                                 );
        poVar10 = std::operator<<(poVar10,":");
        poVar10 = (ostream *)std::ostream::operator<<((ostream *)poVar10,0x1cc);
        poVar10 = std::operator<<(poVar10,": error: ");
        pcVar12 = "inShape.batchRange().minimumValue() == 0";
      }
    }
    else {
      poVar10 = std::operator<<((ostream *)&std::cout,
                                "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/tests/NNShaperTest.cpp"
                               );
      poVar10 = std::operator<<(poVar10,":");
      poVar10 = (ostream *)std::ostream::operator<<((ostream *)poVar10,0x1ca);
      poVar10 = std::operator<<(poVar10,": error: ");
      pcVar12 = "inShape.sequenceRange().maximumValue().isUnbound()";
    }
  }
  else {
    poVar10 = std::operator<<((ostream *)&std::cout,
                              "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/tests/NNShaperTest.cpp"
                             );
    poVar10 = std::operator<<(poVar10,":");
    poVar10 = (ostream *)std::ostream::operator<<((ostream *)poVar10,0x1c9);
    poVar10 = std::operator<<(poVar10,": error: ");
    pcVar12 = "inShape.sequenceRange().minimumValue() == 0";
  }
  poVar10 = std::operator<<(poVar10,pcVar12);
  poVar10 = std::operator<<(poVar10," was false, expected true.");
  std::endl<char,std::char_traits<char>>(poVar10);
  iVar11 = 1;
LAB_0013acf7:
  CoreML::NeuralNetworkShaper::~NeuralNetworkShaper(&shapes);
  CoreML::Specification::Model::~Model(&m1);
  return iVar11;
}

Assistant:

int testSamePaddingConvolution2() {
    
    Specification::Model m1;
    
    auto *topIn = m1.mutable_description()->add_input();
    topIn->set_name("input");
    auto *shape = topIn->mutable_type()->mutable_multiarraytype();
    auto *shape1 = shape->mutable_shaperange()->add_sizeranges();
    shape1->set_lowerbound(4);
    shape1->set_upperbound(4);
    auto *shape2 = shape->mutable_shaperange()->add_sizeranges();
    shape2->set_lowerbound(100);
    shape2->set_upperbound(100);
    auto *shape3 = shape->mutable_shaperange()->add_sizeranges();
    shape3->set_lowerbound(100);
    shape3->set_upperbound(200);
    
    auto *out = m1.mutable_description()->add_output();
    out->set_name("output");
    out->mutable_type()->mutable_multiarraytype();
    
    auto *nn = m1.mutable_neuralnetwork();
    
    Specification::NeuralNetworkLayer *convLayer = nn->add_layers();
    convLayer->add_input("input");
    convLayer->add_output("output");
    Specification::ConvolutionLayerParams *convParams = convLayer->mutable_convolution();
    convParams->set_outputchannels(5);
    convParams->set_kernelchannels(4);
    convParams->add_kernelsize(7);
    convParams->add_kernelsize(8);
    convParams->mutable_same();
    convParams->add_stride(2);
    convParams->add_stride(3);
    convParams->set_hasbias(false);
    for (int i = 0; i < 5*4*7*8; i++) {
        convParams->mutable_weights()->add_floatvalue(1.0);
    }
    
    NeuralNetworkShaper shapes(m1);
    
    const ShapeConstraint &inShape = shapes.shape("input");
    ML_ASSERT(inShape.sequenceRange().minimumValue() == 0);
    ML_ASSERT(inShape.sequenceRange().maximumValue().isUnbound());
    
    ML_ASSERT(inShape.batchRange().minimumValue() == 0);
    ML_ASSERT(inShape.batchRange().maximumValue().isUnbound());
    
    ML_ASSERT(inShape.channelRange().minimumValue() == 4);
    ML_ASSERT(inShape.channelRange().maximumValue().value() == 4);
    
    ML_ASSERT(inShape.heightRange().minimumValue() == 100);
    ML_ASSERT(inShape.heightRange().maximumValue().value() == 100);
    
    ML_ASSERT(inShape.widthRange().minimumValue() == 100);
    ML_ASSERT(inShape.widthRange().maximumValue().value() == 200);
    
    const ShapeConstraint &outShape = shapes.shape("output");
    ML_ASSERT(outShape.sequenceRange().minimumValue() == 0);
    ML_ASSERT(outShape.sequenceRange().maximumValue().isUnbound());
    
    ML_ASSERT(outShape.batchRange().minimumValue() == 0);
    ML_ASSERT(outShape.batchRange().maximumValue().isUnbound());
    
    ML_ASSERT(outShape.channelRange().minimumValue() == 5);
    ML_ASSERT(outShape.channelRange().maximumValue().value() == 5);
    
    ML_ASSERT(outShape.heightRange().minimumValue() == 50);
    ML_ASSERT(outShape.heightRange().maximumValue().value() == 50);
    
    ML_ASSERT(outShape.widthRange().minimumValue() == 34);
    ML_ASSERT(outShape.widthRange().maximumValue().value() == 67);
    
    
    return 0;
    
}